

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O1

int Abc_NtkSizeOfGlobalBdds(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  DdNode **nodeArray;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  uVar1 = pNtk->vCos->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar1 - 1) {
    uVar8 = uVar1;
  }
  __ptr[1] = 0;
  *__ptr = uVar8;
  if (uVar8 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar8 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      lVar10 = *(long *)(*pVVar6->pArray[lVar11] + 0x1b0);
      if (*(int *)(lVar10 + 4) < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar3 = *(int **)(*(long *)(lVar10 + 8) + 0x38);
      if (*(void **)(piVar3 + 2) == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar4 = (int)*(long *)((long)pVVar6->pArray[lVar11] + 0x10);
      lVar10 = (long)iVar4;
      iVar2 = *piVar3;
      if (iVar2 <= iVar4) {
        iVar12 = iVar4 + 10;
        if (iVar4 < iVar2 * 2) {
          iVar12 = iVar2 * 2;
        }
        if (iVar2 < iVar12) {
          pvVar5 = realloc(*(void **)(piVar3 + 2),(long)iVar12 * 8);
          *(void **)(piVar3 + 2) = pvVar5;
          memset((void *)((long)pvVar5 + (long)*piVar3 * 8),0,((long)iVar12 - (long)*piVar3) * 8);
          *piVar3 = iVar12;
        }
      }
      if ((*(long *)(*(long *)(piVar3 + 2) + lVar10 * 8) == 0) &&
         (*(code **)(piVar3 + 8) != (code *)0x0)) {
        uVar7 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
        *(undefined8 *)(*(long *)(piVar3 + 2) + lVar10 * 8) = uVar7;
      }
      uVar7 = *(undefined8 *)(*(long *)(piVar3 + 2) + lVar10 * 8);
      uVar1 = __ptr[1];
      uVar8 = *__ptr;
      if (uVar1 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar9 = 0x10;
        }
        else {
          uVar9 = uVar8 * 2;
          if ((int)uVar9 <= (int)uVar8) goto LAB_002e6ee0;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc((ulong)uVar8 << 4);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar8 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = uVar9;
      }
LAB_002e6ee0:
      __ptr[1] = uVar1 + 1;
      *(undefined8 *)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = uVar7;
      lVar11 = lVar11 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar11 < pVVar6->nSize);
  }
  nodeArray = *(DdNode ***)(__ptr + 2);
  iVar4 = Cudd_SharingSize(nodeArray,__ptr[1]);
  if (nodeArray != (DdNode **)0x0) {
    free(nodeArray);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return iVar4;
}

Assistant:

int Abc_NtkSizeOfGlobalBdds( Abc_Ntk_t * pNtk ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}